

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O0

void __thiscall OpenMesh::PropertyT<short>::push_back(PropertyT<short> *this)

{
  value_type_conflict5 local_12;
  PropertyT<short> *local_10;
  PropertyT<short> *this_local;
  
  local_12 = 0;
  local_10 = this;
  std::vector<short,_std::allocator<short>_>::push_back(&this->data_,&local_12);
  return;
}

Assistant:

virtual void push_back()        { data_.push_back(T()); }